

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

ram_addr_t qemu_ram_addr_from_host_mips64(uc_struct_conflict6 *uc,void *ptr)

{
  ram_addr_t in_RAX;
  RAMBlock *pRVar1;
  ram_addr_t rVar2;
  ram_addr_t offset;
  
  offset = in_RAX;
  pRVar1 = qemu_ram_block_from_host_mips64(uc,ptr,false,&offset);
  if (pRVar1 == (RAMBlock *)0x0) {
    rVar2 = 0xffffffffffffffff;
  }
  else {
    rVar2 = offset + pRVar1->offset;
  }
  return rVar2;
}

Assistant:

ram_addr_t qemu_ram_addr_from_host(struct uc_struct *uc, void *ptr)
{
    RAMBlock *block;
    ram_addr_t offset;

    block = qemu_ram_block_from_host(uc, ptr, false, &offset);
    if (!block) {
        return RAM_ADDR_INVALID;
    }

    return block->offset + offset;
}